

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_functions.cpp
# Opt level: O2

void duckdb::RegisterEnableProfiling(BuiltinFunctions *set)

{
  PragmaFunctionSet functions;
  allocator local_209;
  string local_208;
  string local_1e8;
  FunctionSet<duckdb::PragmaFunction> local_1c8;
  FunctionSet<duckdb::PragmaFunction> local_190;
  FunctionSet<duckdb::PragmaFunction> local_158;
  PragmaFunction local_120;
  
  ::std::__cxx11::string::string
            ((string *)&local_1e8,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_208);
  PragmaFunctionSet::PragmaFunctionSet((PragmaFunctionSet *)&local_1c8,&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  PragmaFunction::PragmaStatement(&local_120,&local_208,PragmaEnableProfilingStatement);
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::
  emplace_back<duckdb::PragmaFunction>
            (&local_1c8.functions.
              super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>,
             &local_120);
  PragmaFunction::~PragmaFunction(&local_120);
  ::std::__cxx11::string::~string((string *)&local_208);
  ::std::__cxx11::string::string((string *)&local_208,"enable_profile",&local_209);
  FunctionSet<duckdb::PragmaFunction>::FunctionSet(&local_158,&local_1c8);
  BuiltinFunctions::AddFunction(set,&local_208,(PragmaFunctionSet *)&local_158);
  FunctionSet<duckdb::PragmaFunction>::~FunctionSet(&local_158);
  ::std::__cxx11::string::~string((string *)&local_208);
  ::std::__cxx11::string::string((string *)&local_208,"enable_profiling",&local_209);
  FunctionSet<duckdb::PragmaFunction>::FunctionSet(&local_190,&local_1c8);
  BuiltinFunctions::AddFunction(set,&local_208,(PragmaFunctionSet *)&local_190);
  FunctionSet<duckdb::PragmaFunction>::~FunctionSet(&local_190);
  ::std::__cxx11::string::~string((string *)&local_208);
  FunctionSet<duckdb::PragmaFunction>::~FunctionSet(&local_1c8);
  return;
}

Assistant:

void RegisterEnableProfiling(BuiltinFunctions &set) {
	PragmaFunctionSet functions("");
	functions.AddFunction(PragmaFunction::PragmaStatement(string(), PragmaEnableProfilingStatement));

	set.AddFunction("enable_profile", functions);
	set.AddFunction("enable_profiling", functions);
}